

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::python::Generator::
GetResolvedFeatures<google::protobuf::EnumValueDescriptor>
          (string *__return_storage_ptr__,Generator *this,EnumValueDescriptor *descriptor)

{
  FileDescriptor *pFVar1;
  FieldDescriptor *pFVar2;
  undefined8 *puVar3;
  pointer ppFVar4;
  bool bVar5;
  Descriptor *pDVar6;
  long lVar7;
  Message *pMVar8;
  EnumDescriptor *descriptor_00;
  LogMessage *this_00;
  Message *extraout_RDX;
  char *in_R8;
  pointer ppFVar9;
  string_view separator;
  AlphaNum local_180;
  long *local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  feature_args;
  undefined1 local_118 [32];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  FormatSpec<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_> local_e0;
  string local_d0;
  string_view local_b0;
  AlphaNum local_80;
  string local_50;
  
  bVar5 = GeneratingDescriptorProto(this);
  if (bVar5) {
    pFVar1 = this->file_;
    pDVar6 = FeatureSet::GetDescriptor();
    lVar7 = google::protobuf::FileDescriptor::FindMessageTypeByName
                      (pFVar1,(*(undefined8 **)(pDVar6 + 8))[1],**(undefined8 **)(pDVar6 + 8));
    if (lVar7 == 0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_180,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/python/generator.cc"
                 ,0x1d7,0x16,"feature_set != nullptr");
      this_00 = absl::lts_20240722::log_internal::LogMessage::operator<<
                          ((LogMessage *)&local_180,
                           (char (*) [44])"Malformed descriptor.proto doesn\'t contain ");
      pDVar6 = FeatureSet::GetDescriptor();
      absl::lts_20240722::log_internal::LogMessage::operator<<
                (this_00,(string *)(*(long *)(pDVar6 + 8) + 0x20));
LAB_002869b3:
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_180);
    }
    std::make_unique<google::protobuf::DynamicMessageFactory>();
    pMVar8 = (Message *)(**(code **)(*local_150 + 0x10))(local_150,lVar7);
    pMVar8 = Message::New(pMVar8);
    google::protobuf::MessageLite::SerializeAsString_abi_cxx11_();
    google::protobuf::MessageLite::ParseFromString
              (pMVar8,local_180.piece_._M_str,local_180.piece_._M_len);
    std::__cxx11::string::~string((string *)&local_180);
    feature_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    feature_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    feature_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    google::protobuf::Message::GetMetadata();
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    google::protobuf::Reflection::ListFields(extraout_RDX,(vector *)pMVar8);
    ppFVar4 = fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar9 = fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppFVar9 != ppFVar4;
        ppFVar9 = ppFVar9 + 1) {
      pFVar2 = *ppFVar9;
      lVar7 = google::protobuf::FieldDescriptor::enum_type();
      if (lVar7 == 0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_180,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/python/generator.cc"
                   ,0x1e9,0x1d,"field->enum_type() != nullptr");
        absl::lts_20240722::log_internal::LogMessage::operator<<
                  ((LogMessage *)&local_180,(char (*) [33])"Unexpected non-enum field found!");
        goto LAB_002869b3;
      }
      if (*(int *)(*(long *)(pFVar2 + 0x38) + 0x90) != 2) {
        descriptor_00 = (EnumDescriptor *)google::protobuf::FieldDescriptor::enum_type();
        google::protobuf::Reflection::GetEnumValue(extraout_RDX,(FieldDescriptor *)pMVar8);
        lVar7 = google::protobuf::EnumDescriptor::FindValueByNumber((int)descriptor_00);
        puVar3 = *(undefined8 **)(pFVar2 + 8);
        local_180.piece_._M_str = (char *)*puVar3;
        local_180.piece_._M_len = puVar3[1];
        local_80.piece_ = absl::lts_20240722::NullSafeStringView("=");
        local_e0.super_type.spec_.data_ = "%s.values_by_name[\"%s\"].number";
        local_e0.super_type.spec_.size_ = 0x1e;
        ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(&local_50,this,descriptor_00);
        absl::lts_20240722::
        StrFormat<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  (&local_d0,&local_e0,&local_50,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar7 + 8));
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_118,&local_180,&local_80);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &feature_args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
        std::__cxx11::string::~string((string *)local_118);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    local_180.piece_ = absl::lts_20240722::NullSafeStringView("_ResolvedFeatures(");
    separator._M_str = in_R8;
    separator._M_len = (size_t)",";
    absl::lts_20240722::strings_internal::
    JoinRange<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_118,(strings_internal *)&feature_args,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1,separator);
    local_b0 = absl::lts_20240722::NullSafeStringView(")");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_180,&local_80);
    std::__cxx11::string::~string((string *)local_118);
    std::
    _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~_Vector_base(&fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&feature_args);
    (**(code **)(*(long *)pMVar8 + 8))(pMVar8);
    if (local_150 != (long *)0x0) {
      (**(code **)(*local_150 + 8))();
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"None",(allocator<char> *)&local_180);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::GetResolvedFeatures(
    const DescriptorT& descriptor) const {
  if (!GeneratingDescriptorProto()) {
    // Everything but descriptor.proto can handle proper feature resolution.
    return "None";
  }

  // Load the resolved features from our pool.
  const Descriptor* feature_set =
      file_->FindMessageTypeByName(FeatureSet::GetDescriptor()->name());
  ABSL_CHECK(feature_set != nullptr)
      << "Malformed descriptor.proto doesn't contain "
      << FeatureSet::GetDescriptor()->full_name();
  auto message_factory = absl::make_unique<DynamicMessageFactory>();
  auto features =
      absl::WrapUnique(message_factory->GetPrototype(feature_set)->New());
  features->ParseFromString(
      GetResolvedSourceFeatures(descriptor).SerializeAsString());

  // Collect all of the resolved features.
  std::vector<std::string> feature_args;
  const Reflection* reflection = features->GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*features, &fields);
  for (const auto* field : fields) {
    // Assume these are all enums.  If we add non-enum global features or any
    // python-specific features, we will need to come back and improve this
    // logic.
    ABSL_CHECK(field->enum_type() != nullptr)
        << "Unexpected non-enum field found!";
    if (field->options().retention() == FieldOptions::RETENTION_SOURCE) {
      // Skip any source-retention features.
      continue;
    }
    const EnumDescriptor* enm = field->enum_type();
    const EnumValueDescriptor* value =
        enm->FindValueByNumber(reflection->GetEnumValue(*features, field));

    feature_args.emplace_back(absl::StrCat(
        field->name(), "=",
        absl::StrFormat("%s.values_by_name[\"%s\"].number",
                        ModuleLevelDescriptorName(*enm), value->name())));
  }
  return absl::StrCat("_ResolvedFeatures(", absl::StrJoin(feature_args, ","),
                      ")");
}